

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::Flag<float>::Flag(Flag<float> *this,char *name,char *type,char *help,float *default_value)

{
  float *pfVar1;
  char *pcVar2;
  shared_ptr<absl::internal::FlagFunc> *this_00;
  FlagFunc *this_01;
  element_type *peVar3;
  shared_ptr<absl::internal::FlagFunc> local_a0;
  allocator<char> local_89;
  string local_88;
  anon_class_8_1_8991fb9c local_68 [3];
  string local_50;
  float *local_30;
  float *default_value_local;
  char *help_local;
  char *type_local;
  char *name_local;
  Flag<float> *this_local;
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_0039e468;
  this->value_ = *default_value;
  this_00 = &this->func_;
  local_30 = default_value;
  default_value_local = (float *)help;
  help_local = type;
  type_local = name;
  name_local = (char *)this;
  this_01 = (FlagFunc *)operator_new(0x58);
  internal::FlagFunc::FlagFunc(this_01);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr<absl::internal::FlagFunc,void>
            (this_00,this_01);
  pcVar2 = type_local;
  peVar3 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pfVar1 = default_value_local;
  peVar3->name = pcVar2;
  peVar3 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  pcVar2 = help_local;
  peVar3->help = (char *)pfVar1;
  peVar3 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  peVar3->type = pcVar2;
  internal::anon_unknown_1::to_str<float>(&local_50,local_30);
  peVar3 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->func_);
  std::__cxx11::string::operator=((string *)&peVar3->default_value,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_68[0].this = this;
  peVar3 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->func_);
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)&peVar3->set_value,local_68);
  pcVar2 = type_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar2,&local_89);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr(&local_a0,&this->func_);
  internal::RegisterFlag(&local_88,&local_a0);
  std::shared_ptr<absl::internal::FlagFunc>::~shared_ptr(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}